

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void callTMres(lua_State *L,StkId res,TValue *f,TValue *p1,TValue *p2)

{
  StkId pTVar1;
  StkId pTVar2;
  Value *pVVar3;
  TValue *o1_3;
  TValue *o2_3;
  TValue *o1_2;
  TValue *o2_2;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  ptrdiff_t result;
  TValue *p2_local;
  TValue *p1_local;
  TValue *f_local;
  StkId res_local;
  lua_State *L_local;
  
  pTVar1 = L->stack;
  pTVar2 = L->top;
  pTVar2->value = f->value;
  pTVar2->tt = f->tt;
  pTVar2 = L->top;
  pTVar2[1].value = p1->value;
  pTVar2[1].tt = p1->tt;
  pTVar2 = L->top;
  pTVar2[2].value = p2->value;
  pTVar2[2].tt = p2->tt;
  if ((long)L->stack_last - (long)L->top < 0x31) {
    luaD_growstack(L,3);
  }
  L->top = L->top + 3;
  luaD_call(L,L->top + -3,1);
  pVVar3 = (Value *)((long)L->stack + ((long)res - (long)pTVar1));
  L->top = L->top + -1;
  pTVar1 = L->top;
  *pVVar3 = pTVar1->value;
  pVVar3[1].b = pTVar1->tt;
  return;
}

Assistant:

static void callTMres (lua_State *L, StkId res, const TValue *f,
                        const TValue *p1, const TValue *p2) {
  ptrdiff_t result = savestack(L, res);
  setobj2s(L, L->top, f);  /* push function */
  setobj2s(L, L->top+1, p1);  /* 1st argument */
  setobj2s(L, L->top+2, p2);  /* 2nd argument */
  luaD_checkstack(L, 3);
  L->top += 3;
  luaD_call(L, L->top - 3, 1);
  res = restorestack(L, result);
  L->top--;
  setobjs2s(L, res, L->top);
}